

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O0

void deblock_edge_luma_ver(pel *src,int stride,int Alpha,int Beta,int edge_flag)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint local_58;
  int local_54;
  int fs;
  int flat_r;
  int flat_l;
  int abs0;
  int R3;
  int R2;
  int R1;
  int R0;
  int L0;
  int L1;
  int L2;
  int L3;
  int line_size;
  int i;
  int edge_flag_local;
  int Beta_local;
  int Alpha_local;
  int stride_local;
  pel *src_local;
  
  L2 = 8;
  if ((edge_flag & 0x101U) != 0x101) {
    L2 = 4;
  }
  _Alpha_local = src;
  if ((edge_flag & 1U) == 0) {
    _Alpha_local = src + (stride << 2);
  }
  L3 = 0;
  while( true ) {
    if (L2 <= L3) {
      return;
    }
    uVar2 = (uint)_Alpha_local[-2];
    uVar3 = (uint)_Alpha_local[-1];
    uVar4 = (uint)*_Alpha_local;
    uVar5 = (uint)_Alpha_local[1];
    iVar6 = uVar4 - uVar3;
    if (iVar6 < 1) {
      iVar6 = -iVar6;
    }
    iVar7 = uVar2 - uVar3;
    if (iVar7 < 1) {
      iVar7 = -iVar7;
    }
    fs = 0;
    if (iVar7 < Beta) {
      fs = 2;
    }
    iVar7 = uVar4 - uVar5;
    if (iVar7 < 1) {
      iVar7 = -iVar7;
    }
    local_54 = 0;
    if (iVar7 < Beta) {
      local_54 = 2;
    }
    iVar7 = _Alpha_local[-3] - uVar3;
    if (iVar7 < 1) {
      iVar7 = -iVar7;
    }
    if (iVar7 < Beta) {
      fs = fs + 1;
    }
    iVar7 = uVar4 - _Alpha_local[2];
    if (iVar7 < 1) {
      iVar7 = -iVar7;
    }
    if (iVar7 < Beta) {
      local_54 = local_54 + 1;
    }
    switch(fs + -3 + local_54) {
    case 0:
      iVar6 = uVar2 - uVar5;
      if (iVar6 < 1) {
        iVar6 = -iVar6;
      }
      local_58 = (uint)(iVar6 < Beta);
      break;
    case 1:
      local_58 = 1;
      if (fs == 2) {
        local_58 = 2;
      }
      break;
    case 2:
      local_58 = 2;
      if (uVar5 == uVar4 && uVar3 == uVar2) {
        local_58 = 3;
      }
      break;
    case 3:
      iVar7 = uVar4 - uVar5;
      if (iVar7 < 1) {
        iVar7 = -iVar7;
      }
      bVar1 = false;
      if (iVar7 <= Beta / 4) {
        iVar7 = uVar3 - uVar2;
        if (iVar7 < 1) {
          iVar7 = -iVar7;
        }
        bVar1 = false;
        if (iVar7 <= Beta / 4) {
          bVar1 = iVar6 < Alpha;
        }
      }
      local_58 = 3;
      if (bVar1) {
        local_58 = 4;
      }
      break;
    default:
      local_58 = 0;
    }
    if (local_58 - 1 < 4) break;
    L3 = L3 + 1;
    _Alpha_local = _Alpha_local + stride;
  }
  (*(code *)(&DAT_0032d940 + *(int *)(&DAT_0032d940 + (ulong)(local_58 - 1) * 4)))();
  return;
}

Assistant:

void deblock_edge_luma_ver(pel *src, int stride, int Alpha, int Beta, int edge_flag)
{
    int i, line_size = 8;

    if ((edge_flag & 0x0101) != 0x0101) {
        line_size = 4;
    }
    if (!(edge_flag & 0x1)) {
        src += 4 * stride;
    }

    for (i = 0; i < line_size; i++, src += stride) {
        int L3 = src[-4];
        int L2 = src[-3];
        int L1 = src[-2];
        int L0 = src[-1];
        int R0 = src[0];
        int R1 = src[1];
        int R2 = src[2];
        int R3 = src[3];
        int abs0 = COM_ABS(R0 - L0);
        int flat_l = (COM_ABS(L1 - L0) < Beta) ? 2 : 0;
        int flat_r = (COM_ABS(R0 - R1) < Beta) ? 2 : 0;
        int fs;

        if (COM_ABS(L2 - L0) < Beta) {
            flat_l++;
        }
        if (COM_ABS(R0 - R2) < Beta) {
            flat_r++;
        }

        switch (flat_l + flat_r) {
        case 6:
            fs = (COM_ABS(R0 - R1) <= Beta / 4 && COM_ABS(L0 - L1) <= Beta / 4 && abs0 < Alpha) ? 4 : 3;
            break;
        case 5:
            fs = (R1 == R0 && L0 == L1) ? 3 : 2;
            break;
        case 4:
            fs = (flat_l == 2) ? 2 : 1;
            break;
        case 3:
            fs = (COM_ABS(L1 - R1) < Beta) ? 1 : 0;
            break;
        default:
            fs = 0;
            break;
        }

        switch (fs) {
        case 4:
            src[-3] = (pel)((((L3 + L2 + L1) << 1) + L0 + R0 + 4) >> 3);                          //L2
            src[-2] = (pel)((((L2 + L0 + L1) << 2) + L1 + R0 * 3 + 8) >> 4);                      //L1
            src[-1] = (pel)(((L2 + R1) * 3 + ((L1 + L0 + R0) << 3) + (L0 << 1) + 16) >> 5);       //L0
            src[ 0] = (pel)(((R2 + L1) * 3 + ((R1 + R0 + L0) << 3) + (R0 << 1) + 16) >> 5);       //R0
            src[ 1] = (pel)((((R2 + R1 + R0) << 2) + R1 + L0 * 3 + 8) >> 4);                      //R1
            src[ 2] = (pel)((((R3 + R2 + R1) << 1) + R0 + L0 + 4) >> 3);                          //R2
            break;
        case 3:
            src[-2] = (pel)((L2 * 3 + L1 * 8 + L0 * 4 + R0 + 8) >> 4);                           //L1
            src[-1] = (pel)((L2 + (L1 << 2) + (L0 << 2) + (L0 << 1) + (R0 << 2) + R1 + 8) >> 4); //L0
            src[ 0] = (pel)((L1 + (L0 << 2) + (R0 << 2) + (R0 << 1) + (R1 << 2) + R2 + 8) >> 4); //R0
            src[ 1] = (pel)((R2 * 3 + R1 * 8 + R0 * 4 + L0 + 8) >> 4);                           //R1
            break;
        case 2:
            src[-1] = (pel)(((L1 << 1) + L1 + (L0 << 3) + (L0 << 1) + (R0 << 1) + R0 + 8) >> 4);
            src[ 0] = (pel)(((L0 << 1) + L0 + (R0 << 3) + (R0 << 1) + (R1 << 1) + R1 + 8) >> 4);
            break;
        case 1:
            src[-1] = (pel)((L0 * 3 + R0 + 2) >> 2);
            src[ 0] = (pel)((R0 * 3 + L0 + 2) >> 2);
            break;
        default:
            break;
        }
    }
}